

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * checkChi(string *__return_storage_ptr__,string *newCard)

{
  char cVar1;
  int iVar2;
  mapped_type *pmVar3;
  uint *puVar4;
  mapped_type mVar5;
  string *this;
  uint uVar6;
  mapped_type mVar7;
  uint uVar8;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cVar1 = *(newCard->_M_dataplus)._M_p;
  if ((cVar1 == 'J') || (cVar1 == 'F')) {
LAB_0010f9c0:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Fail",(allocator *)&local_2d0);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_50,(string *)newCard);
  previousCard(&local_250,&local_50);
  previousCard(&local_2d0,&local_250);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&my_active_card_abi_cxx11_,&local_2d0);
  iVar2 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_50);
  if (iVar2 == 0) {
    mVar5 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)newCard);
    previousCard(&local_270,&local_70);
    previousCard(&local_2d0,&local_270);
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&my_active_card_abi_cxx11_,&local_2d0);
    mVar5 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)&local_90,(string *)newCard);
  previousCard(&local_2d0,&local_90);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&my_active_card_abi_cxx11_,&local_2d0);
  iVar2 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_90);
  if (iVar2 == 0) {
    uVar6 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,(string *)newCard);
    previousCard(&local_2d0,&local_b0);
    puVar4 = (uint *)std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&my_active_card_abi_cxx11_,&local_2d0);
    uVar6 = *puVar4;
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::string((string *)&local_d0,(string *)newCard);
  postCard(&local_290,&local_d0);
  postCard(&local_2d0,&local_290);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&my_active_card_abi_cxx11_,&local_2d0);
  iVar2 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_d0);
  if (iVar2 == 0) {
    mVar7 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,(string *)newCard);
    postCard(&local_2b0,&local_f0);
    postCard(&local_2d0,&local_2b0);
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&my_active_card_abi_cxx11_,&local_2d0);
    mVar7 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::string((string *)&local_110,(string *)newCard);
  postCard(&local_2d0,&local_110);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&my_active_card_abi_cxx11_,&local_2d0);
  iVar2 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_110);
  if (iVar2 == 0) {
    uVar8 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_130,(string *)newCard);
    postCard(&local_2d0,&local_130);
    puVar4 = (uint *)std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&my_active_card_abi_cxx11_,&local_2d0);
    uVar8 = *puVar4;
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  if ((newCard->_M_dataplus)._M_p[1] < '6') {
    if (mVar5 == 1 && (uVar6 ^ 1) == 0) {
      std::__cxx11::string::string((string *)&local_190,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_190);
      this = &local_190;
    }
    else {
      if ((uVar6 ^ 1) == 0 && (uVar8 ^ 1) == 0) goto LAB_0010fd88;
      if ((uVar8 ^ 1) == 0 && mVar7 == 1) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)newCard);
        postCard(__return_storage_ptr__,&local_1b0);
        this = &local_1b0;
      }
      else if (mVar5 == 2 && (uVar6 ^ 2) == 0) {
        std::__cxx11::string::string((string *)&local_210,(string *)newCard);
        previousCard(__return_storage_ptr__,&local_210);
        this = &local_210;
      }
      else {
        if ((uVar6 ^ 2) == 0 && (uVar8 ^ 2) == 0) goto LAB_0010fd88;
        if ((uVar8 ^ 2) != 0 || mVar7 != 2) goto LAB_0010f9c0;
        std::__cxx11::string::string((string *)&local_230,(string *)newCard);
        postCard(__return_storage_ptr__,&local_230);
        this = &local_230;
      }
    }
  }
  else if (mVar7 == 1 && (uVar8 ^ 1) == 0) {
    std::__cxx11::string::string((string *)&local_150,(string *)newCard);
    postCard(__return_storage_ptr__,&local_150);
    this = &local_150;
  }
  else {
    if ((uVar8 ^ 1) == 0 && (uVar6 ^ 1) == 0) {
LAB_0010fd88:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)newCard);
      return __return_storage_ptr__;
    }
    if ((uVar6 ^ 1) == 0 && mVar5 == 1) {
      std::__cxx11::string::string((string *)&local_170,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_170);
      this = &local_170;
    }
    else if (mVar7 == 2 && (uVar8 ^ 2) == 0) {
      std::__cxx11::string::string((string *)&local_1d0,(string *)newCard);
      postCard(__return_storage_ptr__,&local_1d0);
      this = &local_1d0;
    }
    else {
      if ((uVar8 ^ 2) == 0 && (uVar6 ^ 2) == 0) goto LAB_0010fd88;
      if ((uVar6 ^ 2) != 0 || mVar5 != 2) goto LAB_0010f9c0;
      std::__cxx11::string::string((string *)&local_1f0,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_1f0);
      this = &local_1f0;
    }
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

string checkChi(string newCard) {
    //return "Fail";
    if (newCard[0] == 'F' || newCard[0] == 'J')
        return "Fail";
    int flag_1 = 0, flag_2 = 0, flag0 = 0, flag1 = 0, flag2 = 0;
    if (my_active_card[previousCard(previousCard(newCard))]) {
        flag_2 = my_active_card[previousCard(previousCard(newCard))];
    }
    if (my_active_card[previousCard(newCard)]) {
        flag_1 = my_active_card[previousCard(newCard)];
    }
    flag0 = 1;
    if (my_active_card[postCard(postCard(newCard))]) {
        flag2 = my_active_card[postCard(postCard(newCard))];
    }
    if (my_active_card[postCard(newCard)]) {
        flag1 = my_active_card[postCard(newCard)];
    }
    if (newCard[1] - '0' > 5) {
        if (flag1 == 1 && flag2 == 1) {
            return postCard(newCard);
        }
        if (flag_1 == 1 && flag1 == 1) {
            return newCard;
        }
        if (flag_1 == 1 && flag_2 == 1) {
            return previousCard(newCard);
        }
    }
    else {
        if (flag_1 == 1 && flag_2 == 1) {
            return previousCard(newCard);
        }
        if (flag_1 == 1 && flag1 == 1) {
            return newCard;
        }
        if (flag1 == 1 && flag2 == 1) {
            return postCard(newCard);
        }
    }
    if (newCard[1] - '0' > 5) {
        if (flag1 == 2 && flag2 == 2) {
            return postCard(newCard);
        }
        if (flag_1 == 2 && flag1 == 2) {
            return newCard;
        }
        if (flag_1 == 2 && flag_2 == 2) {
            return previousCard(newCard);
        }
    }
    else {
        if (flag_1 == 2 && flag_2 == 2) {
            return previousCard(newCard);
        }
        if (flag_1 == 2 && flag1 == 2) {
            return newCard;
        }
        if (flag1 == 2 && flag2 == 2) {
            return postCard(newCard);
        }
    }
    return "Fail";
    /*
    vector<string> card;
    card = all_card[my_player_id];
    card.push_back(newCard);
    sort(card.begin(), card.end());
    vector<string>::iterator itr;
    vector<string>::iterator tmptr;
    itr = find(card.begin(), card.end(), newCard);
    string str_1 = "N";
    string str_2 = "N";
    string str1 = "N";
    string str2 = "N";
    string str0 = *(itr);
    tmptr = itr;
    while (itr != card.begin() && !strcmp(tmptr->c_str(), itr->c_str()) {
        tmptr = itr - 1;
    }
    str_1 = *tmptr;
    tmptr = itr;
    while (itr != card.begin() && itr - 1 != card.begin() && !strcmp(tmptr->c_str(), itr->c_str()) {
        tmptr = itr - 1;
    }
    str_1 = *tmptr;
    if (itr - 1 != card.begin()) { str_2 = *(itr - 2); }
    //itr++; itr++;

    if (itr + 1 != card.end()) str1 = *(itr + 1);
    //itr++; itr++;
    if (itr + 2 < card.end()) str2 = *(itr + 2);

    if (str_1[0] == newCard[0] && str_2[0] == newCard[0]) {
        if (str_1.length() > 1 && str_2.length() > 1 && newCard[1] - str_1[1] == 1 && str_1[1] - str_2[1] == 1) {
            return str_1;
        }
    }
    if (str1[0] == newCard[0] && str2[0] == newCard[0]) {
        if (str1.length() > 1 && str2.length() > 1 && newCard[1] - str1[1] == -1 && str1[1] - str2[1] == -1) {
            return str1;
        }
    }
    if (str_1[0] == newCard[0] && str1[0] == newCard[0]) {
        if (str_1.length() > 1 && str1.length() > 1 && newCard[1] - str_1[1] == 1 && str1[1] - newCard[1] == 1) {
            return newCard;
        }
    }
    */

}